

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

int Hex::Hexdumper<char>::count_identical_lines(char *first,char *last,int unitsperline)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  pair<const_char_*,_const_char_*> thisline;
  pair<const_char_*,_const_char_*> firstline;
  pair<const_char_*,_const_char_*> local_50;
  pair<const_char_*,_const_char_*> local_40;
  
  lVar3 = (long)unitsperline;
  pcVar4 = first + lVar3;
  iVar2 = 1;
  if (pcVar4 < last) {
    pcVar5 = first + lVar3 * 2;
    local_40.first = first;
    local_40.second = pcVar4;
    do {
      local_50.second = last;
      if (pcVar5 < last) {
        local_50.second = pcVar5;
      }
      local_50.first = pcVar4;
      bVar1 = data_is_equal<std::pair<char_const*,char_const*>>(&local_40,&local_50);
      if (!bVar1) {
        return iVar2;
      }
      pcVar4 = pcVar4 + lVar3;
      iVar2 = iVar2 + 1;
      pcVar5 = pcVar5 + lVar3;
    } while (pcVar4 < last);
  }
  return iVar2;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }